

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_BoxList.cpp
# Opt level: O0

BoxList * __thiscall amrex::BoxList::convert(BoxList *this,IndexType typ)

{
  bool bVar1;
  byte bVar2;
  uint in_ESI;
  BoxList *in_RDI;
  Box *bx;
  iterator __end1;
  iterator __begin1;
  Vector<amrex::Box,_std::allocator<amrex::Box>_> *__range1;
  int off;
  uint bitval;
  uint typ_1;
  int dir;
  IndexType *in_stack_ffffffffffffff08;
  reference in_stack_ffffffffffffff10;
  __normal_iterator<amrex::Box_*,_std::vector<amrex::Box,_std::allocator<amrex::Box>_>_>
  local_c8 [3];
  uint local_ac;
  int local_a8;
  uint local_a4;
  uint local_a0;
  int local_9c;
  reference local_98;
  uint local_90;
  int local_8c;
  IndexType *local_88;
  int local_7c;
  uint *local_78;
  int local_6c;
  uint *local_68;
  int local_5c;
  IndexType *local_58;
  int local_50;
  int local_4c;
  int local_48;
  int local_44;
  IntVect *local_40;
  uint local_38;
  int local_34;
  IndexType *local_30;
  int local_24;
  IndexType *local_20;
  int local_18;
  int local_14;
  IndexType *local_10;
  int local_4;
  
  (in_RDI->btype).itype = in_ESI;
  local_ac = in_ESI;
  local_c8[0]._M_current =
       (Box *)std::vector<amrex::Box,_std::allocator<amrex::Box>_>::begin
                        ((vector<amrex::Box,_std::allocator<amrex::Box>_> *)
                         in_stack_ffffffffffffff08);
  std::vector<amrex::Box,_std::allocator<amrex::Box>_>::end
            ((vector<amrex::Box,_std::allocator<amrex::Box>_> *)in_stack_ffffffffffffff08);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<amrex::Box_*,_std::vector<amrex::Box,_std::allocator<amrex::Box>_>_>
                        *)in_stack_ffffffffffffff10,
                       (__normal_iterator<amrex::Box_*,_std::vector<amrex::Box,_std::allocator<amrex::Box>_>_>
                        *)in_stack_ffffffffffffff08);
    if (!bVar1) break;
    in_stack_ffffffffffffff10 =
         __gnu_cxx::
         __normal_iterator<amrex::Box_*,_std::vector<amrex::Box,_std::allocator<amrex::Box>_>_>::
         operator*(local_c8);
    local_90 = local_ac;
    for (local_9c = 0; local_9c < 3; local_9c = local_9c + 1) {
      local_78 = &local_90;
      local_7c = local_9c;
      local_6c = local_9c;
      local_4c = local_9c;
      bVar2 = (byte)local_9c;
      local_a0 = (uint)((local_ac & 1 << (bVar2 & 0x1f)) != 0);
      local_88 = &in_stack_ffffffffffffff10->btype;
      local_8c = local_9c;
      local_5c = local_9c;
      local_50 = local_9c;
      local_a4 = (uint)((local_88->itype & 1 << (bVar2 & 0x1f)) != 0);
      local_a8 = local_a0 - local_a4;
      local_40 = &in_stack_ffffffffffffff10->bigend;
      local_44 = local_9c;
      local_40->vect[local_9c] = local_a8 + local_40->vect[local_9c];
      in_stack_ffffffffffffff08 = &in_stack_ffffffffffffff10->btype;
      local_34 = local_9c;
      if (local_a0 == 0) {
        local_24 = local_9c;
        local_18 = local_9c;
        in_stack_ffffffffffffff08->itype =
             (1 << (bVar2 & 0x1f) ^ 0xffffffffU) & in_stack_ffffffffffffff08->itype;
        local_20 = in_stack_ffffffffffffff08;
      }
      else {
        local_14 = local_9c;
        local_4 = local_9c;
        in_stack_ffffffffffffff08->itype = 1 << (bVar2 & 0x1f) | in_stack_ffffffffffffff08->itype;
        local_10 = in_stack_ffffffffffffff08;
      }
      local_68 = local_78;
      local_58 = local_88;
      local_48 = local_a8;
      local_38 = local_a0;
      local_30 = in_stack_ffffffffffffff08;
    }
    local_98 = in_stack_ffffffffffffff10;
    __gnu_cxx::
    __normal_iterator<amrex::Box_*,_std::vector<amrex::Box,_std::allocator<amrex::Box>_>_>::
    operator++(local_c8);
  }
  return in_RDI;
}

Assistant:

BoxList&
BoxList::convert (IndexType typ) noexcept
{
    btype = typ;
    for (auto& bx : m_lbox)
    {
        bx.convert(typ);
    }
    return *this;
}